

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall phosg::Image::set_has_alpha(Image *this,bool new_has_alpha)

{
  size_t __size;
  void *pvVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t dst_index;
  size_t src_index;
  ssize_t z;
  DataPtrs new_data;
  bool new_has_alpha_local;
  Image *this_local;
  
  if ((bool)(this->has_alpha & 1U) != new_has_alpha) {
    this->has_alpha = new_has_alpha;
    __size = get_data_size(this);
    pvVar1 = malloc(__size);
    for (src_index = 0; (long)src_index < this->width * this->height; src_index = src_index + 1) {
      iVar4 = 4;
      if ((this->has_alpha & 1U) != 0) {
        iVar4 = 3;
      }
      lVar2 = src_index * (long)iVar4;
      iVar4 = 3;
      if ((this->has_alpha & 1U) != 0) {
        iVar4 = 4;
      }
      lVar3 = src_index * (long)iVar4;
      if (this->channel_width == '\b') {
        *(undefined1 *)((long)pvVar1 + lVar3) = *(undefined1 *)((long)(this->data).raw + lVar2);
        *(undefined1 *)((long)pvVar1 + lVar3 + 1) =
             *(undefined1 *)((long)(this->data).raw + lVar2 + 1);
        *(undefined1 *)((long)pvVar1 + lVar3 + 2) =
             *(undefined1 *)((long)(this->data).raw + lVar2 + 2);
        if ((this->has_alpha & 1U) != 0) {
          *(char *)((long)pvVar1 + lVar3 + 3) = (char)this->max_value;
        }
      }
      else if (this->channel_width == '\x10') {
        *(undefined2 *)((long)pvVar1 + lVar3 * 2) =
             *(undefined2 *)((long)(this->data).raw + lVar2 * 2);
        *(undefined2 *)((long)pvVar1 + lVar3 * 2 + 2) =
             *(undefined2 *)((long)(this->data).raw + lVar2 * 2 + 2);
        *(undefined2 *)((long)pvVar1 + lVar3 * 2 + 4) =
             *(undefined2 *)((long)(this->data).raw + lVar2 * 2 + 4);
        if ((this->has_alpha & 1U) != 0) {
          *(short *)((long)pvVar1 + lVar3 * 2 + 6) = (short)this->max_value;
        }
      }
      else if (this->channel_width == ' ') {
        *(undefined4 *)((long)pvVar1 + lVar3 * 4) =
             *(undefined4 *)((long)(this->data).raw + lVar2 * 4);
        *(undefined4 *)((long)pvVar1 + lVar3 * 4 + 4) =
             *(undefined4 *)((long)(this->data).raw + lVar2 * 4 + 4);
        *(undefined4 *)((long)pvVar1 + lVar3 * 4 + 8) =
             *(undefined4 *)((long)(this->data).raw + lVar2 * 4 + 8);
        if ((this->has_alpha & 1U) != 0) {
          *(int *)((long)pvVar1 + lVar3 * 4 + 0xc) = (int)this->max_value;
        }
      }
      else if (this->channel_width == '@') {
        *(undefined8 *)((long)pvVar1 + lVar3 * 8) =
             *(undefined8 *)((long)(this->data).raw + lVar2 * 8);
        *(undefined8 *)((long)pvVar1 + lVar3 * 8 + 8) =
             *(undefined8 *)((long)(this->data).raw + lVar2 * 8 + 8);
        *(undefined8 *)((long)pvVar1 + lVar3 * 8 + 0x10) =
             *(undefined8 *)((long)(this->data).raw + lVar2 * 8 + 0x10);
        if ((this->has_alpha & 1U) != 0) {
          *(uint64_t *)((long)pvVar1 + lVar3 * 8 + 0x18) = this->max_value;
        }
      }
    }
    free((this->data).raw);
    (this->data).raw = pvVar1;
  }
  return;
}

Assistant:

void Image::set_has_alpha(bool new_has_alpha) {
  if (this->has_alpha == new_has_alpha) {
    return;
  }
  this->has_alpha = new_has_alpha;

  DataPtrs new_data;
  new_data.raw = malloc(this->get_data_size());

  for (ssize_t z = 0; z < this->width * this->height; z++) {
    size_t src_index = z * (this->has_alpha ? 3 : 4);
    size_t dst_index = z * (this->has_alpha ? 4 : 3);

    if (this->channel_width == 8) {
      new_data.as8[dst_index + 0] = this->data.as8[src_index + 0];
      new_data.as8[dst_index + 1] = this->data.as8[src_index + 1];
      new_data.as8[dst_index + 2] = this->data.as8[src_index + 2];
      if (this->has_alpha) {
        new_data.as8[dst_index + 3] = this->max_value;
      }
    } else if (this->channel_width == 16) {
      new_data.as16[dst_index + 0] = this->data.as16[src_index + 0];
      new_data.as16[dst_index + 1] = this->data.as16[src_index + 1];
      new_data.as16[dst_index + 2] = this->data.as16[src_index + 2];
      if (this->has_alpha) {
        new_data.as16[dst_index + 3] = this->max_value;
      }
    } else if (this->channel_width == 32) {
      new_data.as32[dst_index + 0] = this->data.as32[src_index + 0];
      new_data.as32[dst_index + 1] = this->data.as32[src_index + 1];
      new_data.as32[dst_index + 2] = this->data.as32[src_index + 2];
      if (this->has_alpha) {
        new_data.as32[dst_index + 3] = this->max_value;
      }
    } else if (this->channel_width == 64) {
      new_data.as64[dst_index + 0] = this->data.as64[src_index + 0];
      new_data.as64[dst_index + 1] = this->data.as64[src_index + 1];
      new_data.as64[dst_index + 2] = this->data.as64[src_index + 2];
      if (this->has_alpha) {
        new_data.as64[dst_index + 3] = this->max_value;
      }
    }
  }

  free(this->data.raw);
  this->data.raw = new_data.raw;
}